

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Region.cpp
# Opt level: O3

Region * __thiscall Region::GetSelfOrFirstTryAncestor(Region *this)

{
  Region **ppRVar1;
  Region *pRVar2;
  
  pRVar2 = this;
  if (this->selfOrFirstTryAncestor != (Region *)0x0) {
    return this->selfOrFirstTryAncestor;
  }
  do {
    if (pRVar2->type == RegionTypeTry) goto LAB_0061f6e5;
    ppRVar1 = &pRVar2->parent;
    pRVar2 = *ppRVar1;
  } while (*ppRVar1 != (Region *)0x0);
  pRVar2 = (Region *)0x0;
LAB_0061f6e5:
  this->selfOrFirstTryAncestor = pRVar2;
  return pRVar2;
}

Assistant:

Region *
Region::GetSelfOrFirstTryAncestor()
{
    if (!this->selfOrFirstTryAncestor)
    {
        Region* region = this;
        while (region && region->GetType() != RegionTypeTry)
        {
            region = region->GetParent();
        }
        this->selfOrFirstTryAncestor = region;
    }
    return this->selfOrFirstTryAncestor;
}